

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O3

void __thiscall
Rml::ElementFormControlTextArea::SetWordWrap(ElementFormControlTextArea *this,bool word_wrap)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  String local_38;
  
  bVar2 = GetWordWrap(this);
  if (bVar2 != word_wrap) {
    paVar1 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar1;
    if (word_wrap) {
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"wrap","");
      Element::RemoveAttribute((Element *)this,&local_38);
    }
    else {
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"wrap","");
      Element::SetAttribute<char[7]>((Element *)this,&local_38,(char (*) [7])"nowrap");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ElementFormControlTextArea::SetWordWrap(bool word_wrap)
{
	if (word_wrap != GetWordWrap())
	{
		if (word_wrap)
			RemoveAttribute("wrap");
		else
			SetAttribute("wrap", "nowrap");
	}
}